

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

size_t ma_dr_wav__write_or_count_string_to_fixed_size_buf
                 (ma_dr_wav *pWav,char *str,size_t bufFixedSize)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  undefined1 local_29;
  
  if (pWav != (ma_dr_wav *)0x0) {
    sVar1 = ma_dr_wav__strlen_clamped(str,bufFixedSize);
    (*pWav->onWrite)(pWav->pUserData,str,sVar1);
    lVar2 = bufFixedSize - sVar1;
    if (sVar1 <= bufFixedSize && lVar2 != 0) {
      while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
        local_29 = 0;
        (*pWav->onWrite)(pWav->pUserData,&local_29,1);
      }
    }
  }
  return bufFixedSize;
}

Assistant:

MA_PRIVATE size_t ma_dr_wav__write_or_count_string_to_fixed_size_buf(ma_dr_wav* pWav, char* str, size_t bufFixedSize)
{
    size_t len;
    if (pWav == NULL) {
        return bufFixedSize;
    }
    len = ma_dr_wav__strlen_clamped(str, bufFixedSize);
    ma_dr_wav__write_or_count(pWav, str, len);
    if (len < bufFixedSize) {
        size_t i;
        for (i = 0; i < bufFixedSize - len; ++i) {
            ma_dr_wav__write_byte(pWav, 0);
        }
    }
    return bufFixedSize;
}